

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O2

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenId(Lexer *this)

{
  pointer ptVar1;
  __type _Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Lexer *in_RSI;
  unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 local_90 [8];
  vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  keywords;
  undefined1 local_70 [32];
  string id;
  
  id._M_dataplus._M_p = (pointer)&id.field_2;
  id._M_string_length = 0;
  id.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&id);
  while (iVar5 = in_RSI->currentChar, iVar5 == 0x5f) {
    std::__cxx11::string::push_back((char)&id);
    nextChar(in_RSI);
  }
  if (iVar5 - 0x30U < 10) {
    local_90._6_2_ = 2;
    local_90._0_4_ = LEX_ERR_ID_NO_DIGIT_AFTER_ANYS;
    getCurrentCursor((Position *)(local_70 + 8),in_RSI);
    keywords.
    super__Vector_base<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_RSI->currentEndIndex;
    keywords.
    super__Vector_base<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         keywords.
         super__Vector_base<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    std::
    make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
              ((Level *)local_70,(LexerErrorCode *)(local_90 + 6),(Position *)local_90);
    this_00 = (unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
               *)local_70;
  }
  else {
    iVar4 = isalpha(iVar5);
    if (iVar4 != 0) {
      do {
        if (iVar5 != 0x5f) {
          iVar5 = isalnum(iVar5);
          if (iVar5 == 0) goto LAB_0010892a;
        }
        std::__cxx11::string::push_back((char)&id);
        nextChar(in_RSI);
        iVar5 = in_RSI->currentChar;
      } while( true );
    }
    bVar3 = std::operator==(&id,"_");
    if (bVar3) {
      local_70._8_2_ = 0x5e;
      getCurrentCursor((Position *)&keywords,in_RSI);
      std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
                ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)(local_70 + 8));
      goto LAB_001088ca;
    }
    local_90._0_2_ = 2;
    local_70._0_4_ = 2;
    getCurrentCursor((Position *)&keywords,in_RSI);
    std::
    make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
              ((Level *)(local_70 + 8),(LexerErrorCode *)local_90,(Position *)local_70);
    this_00 = (unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
               *)(local_70 + 8);
  }
  generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                      *)in_RSI);
  std::
  unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
  ::~unique_ptr(this_00);
  goto LAB_001088ca;
LAB_0010892a:
  if (id._M_string_length - 2 < 7) {
    std::
    vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&keywords,
             (vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(KEYWORDS_abi_cxx11_ + (id._M_string_length - 2) * 0x18));
    ptVar1 = keywords.
             super__Vector_base<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 keywords.
                 super__Vector_base<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ptVar1;
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &__lhs[1]._M_string_length) {
      _Var2 = std::operator==(__lhs,&id);
      if (_Var2) {
        getCurrentCursor((Position *)(local_70 + 8),in_RSI);
        std::
        make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType_const&,pfederc::Position>
                  ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)(__lhs + 1));
        std::
        vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&keywords);
        goto LAB_001088ca;
      }
    }
    std::
    vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&keywords);
  }
  bVar3 = std::operator==(&id,"null");
  if (bVar3) {
    local_70._8_2_ = 0x3e;
    getCurrentCursor((Position *)&keywords,in_RSI);
    std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
              ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)(local_70 + 8));
  }
  else {
    local_70._8_2_ = 5;
    getCurrentCursor((Position *)&keywords,in_RSI);
    std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
              ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)(local_70 + 8));
  }
LAB_001088ca:
  std::__cxx11::string::~string((string *)&id);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenId() noexcept {
  std::string id;
  id.reserve(16);
  // eat _ (important for checking if followed by alphabetic char)
  while (currentChar == '_') {
    id += currentChar;
    nextChar();
  }
  // must be followed by alpha character or just valid _ (TokenType::TOK_ANY)
  if (isdigit(currentChar)) {
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_ID_NO_DIGIT_AFTER_ANYS, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));
  } else if (!isalpha(currentChar)) {
    // check for any
    if (id == "_")
      return std::make_unique<Token>(currentToken, TokenType::TOK_ANY, getCurrentCursor());
    // __+ is not allowed
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_ID_NOT_JUST_ANYS, getCurrentCursor()));
  }

  while (currentChar == '_' || isalnum(currentChar)) {
    id += currentChar;
    nextChar();
  }

  // check if keword
  if (id.size() >= KEYWORDS_MIN_STRING_LENGTH
    && id.size() < KEYWORDS_MIN_STRING_LENGTH + KEYWORDS_LENGTH) {
    auto keywords = KEYWORDS[id.size() - KEYWORDS_MIN_STRING_LENGTH];
    for (const auto &tpl : keywords) {
      if (std::get<1>(tpl) == id)
        return std::make_unique<Token>(currentToken, std::get<0>(tpl), getCurrentCursor());
    }
  }
  // check if operator
  if (id == "null")
    return std::make_unique<Token>(currentToken, TokenType::TOK_OP_NULL, getCurrentCursor());

  return std::make_unique<Token>(currentToken, TokenType::TOK_ID, getCurrentCursor());
}